

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall FIX::Message::validate(Message *this)

{
  ostream *poVar1;
  InvalidMessage *pIVar2;
  string fieldName_1;
  FieldNotFound *e;
  string fieldName;
  IncorrectDataFormat *e_1;
  string local_398;
  stringstream local_378 [8];
  stringstream text_1;
  ostream local_368 [376];
  int local_1f0;
  int local_1ec;
  int actualChecksum;
  int expectedChecksum;
  CheckSum *aCheckSum;
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream text;
  ostream local_1a8 [380];
  int local_2c;
  int local_28;
  int actualLength;
  int expectedLength;
  FieldBase *local_18;
  BodyLength *aBodyLength;
  Message *this_local;
  
  aBodyLength = (BodyLength *)this;
  local_18 = FieldMap::getFieldRef(&(this->m_header).super_FieldMap,9);
  local_28 = IntField::operator_cast_to_int((IntField *)local_18);
  local_2c = bodyLength(this,8,9,10);
  if (local_28 != local_2c) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar1 = std::operator<<(local_1a8,"Expected BodyLength=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
    poVar1 = std::operator<<(poVar1,", Received BodyLength=");
    std::ostream::operator<<(poVar1,local_28);
    aCheckSum._7_1_ = 1;
    pIVar2 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::stringstream::str();
    InvalidMessage::InvalidMessage(pIVar2,&local_1d8);
    aCheckSum._7_1_ = 0;
    __cxa_throw(pIVar2,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  _actualChecksum = FieldMap::getFieldRef(&(this->m_trailer).super_FieldMap,10);
  local_1ec = CheckSumField::operator_cast_to_int((CheckSumField *)_actualChecksum);
  local_1f0 = checkSum(this,10);
  if (local_1ec != local_1f0) {
    std::__cxx11::stringstream::stringstream(local_378);
    poVar1 = std::operator<<(local_368,"Expected CheckSum=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1f0);
    poVar1 = std::operator<<(poVar1,", Received CheckSum=");
    std::ostream::operator<<(poVar1,local_1ec);
    pIVar2 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::stringstream::str();
    InvalidMessage::InvalidMessage(pIVar2,&local_398);
    __cxa_throw(pIVar2,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  return;
}

Assistant:

void Message::validate() const
{
  try
  {
    const BodyLength& aBodyLength = FIELD_GET_REF( m_header, BodyLength );

    const int expectedLength = (int)aBodyLength;
    const int actualLength = bodyLength();

    if ( expectedLength != actualLength )
    {
      std::stringstream text;
      text << "Expected BodyLength=" << actualLength
           << ", Received BodyLength=" << expectedLength;
      throw InvalidMessage(text.str());
    }

    const CheckSum& aCheckSum = FIELD_GET_REF( m_trailer, CheckSum );

    const int expectedChecksum = (int)aCheckSum;
    const int actualChecksum = checkSum();

    if ( expectedChecksum != actualChecksum )
    {
      std::stringstream text;
      text << "Expected CheckSum=" << actualChecksum
           << ", Received CheckSum=" << expectedChecksum;
      throw InvalidMessage(text.str());
    }
  }
  catch ( FieldNotFound& e )
  {
    const std::string fieldName = ( e.field == FIX::FIELD::BodyLength ) ? "BodyLength" : "CheckSum";
    throw InvalidMessage( fieldName + std::string(" is missing") );
  }
  catch ( IncorrectDataFormat& e )
  {
    const std::string fieldName = ( e.field == FIX::FIELD::BodyLength ) ? "BodyLength" : "CheckSum";
    throw InvalidMessage( fieldName + std::string(" has wrong format: ") + e.detail );
  }
}